

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O2

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicCapability>
          (Orphan<capnp::DynamicValue> *this,Orphan<capnp::DynamicCapability> *other)

{
  Client local_78;
  Builder local_60;
  
  capnp::Orphan<capnp::DynamicCapability>::get(&local_78,other);
  local_60.field_1.textValue.content.ptr = (char *)local_78.super_Client.hook.ptr;
  local_60.type = CAPABILITY;
  local_78.super_Client.hook.ptr = (ClientHook *)0x0;
  local_60.field_1.intValue = (int64_t)local_78.super_Client.hook.disposer;
  local_60.field_1.textValue.content.size_ = (size_t)local_78.schema.super_Schema.raw;
  Orphan(this,&local_60,&other->builder);
  DynamicValue::Builder::~Builder(&local_60);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&local_78);
  return;
}

Assistant:

inline Orphan<DynamicValue>::Orphan(Orphan<T>&& other)
    : Orphan(other.get(), kj::mv(other.builder)) {}